

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_texture_integer(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_texture_integer != 0) {
    glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)(*load)("glTexParameterIivEXT");
    glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)(*load)("glTexParameterIuivEXT");
    glad_glGetTexParameterIivEXT =
         (PFNGLGETTEXPARAMETERIIVEXTPROC)(*load)("glGetTexParameterIivEXT");
    glad_glGetTexParameterIuivEXT =
         (PFNGLGETTEXPARAMETERIUIVEXTPROC)(*load)("glGetTexParameterIuivEXT");
    glad_glClearColorIiEXT = (PFNGLCLEARCOLORIIEXTPROC)(*load)("glClearColorIiEXT");
    glad_glClearColorIuiEXT = (PFNGLCLEARCOLORIUIEXTPROC)(*load)("glClearColorIuiEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_texture_integer(GLADloadproc load) {
	if(!GLAD_GL_EXT_texture_integer) return;
	glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)load("glTexParameterIivEXT");
	glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)load("glTexParameterIuivEXT");
	glad_glGetTexParameterIivEXT = (PFNGLGETTEXPARAMETERIIVEXTPROC)load("glGetTexParameterIivEXT");
	glad_glGetTexParameterIuivEXT = (PFNGLGETTEXPARAMETERIUIVEXTPROC)load("glGetTexParameterIuivEXT");
	glad_glClearColorIiEXT = (PFNGLCLEARCOLORIIEXTPROC)load("glClearColorIiEXT");
	glad_glClearColorIuiEXT = (PFNGLCLEARCOLORIUIEXTPROC)load("glClearColorIuiEXT");
}